

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse2.h
# Opt level: O0

void store_16bit_to_32bit(__m128i a,int32_t *b)

{
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  __m128i a_2;
  __m128i a_1;
  __m128i a_hi;
  __m128i a_lo;
  undefined4 uStack_3c;
  int32_t *b_local;
  __m128i a_local;
  
  local_a8 = (undefined2)in_XMM0_Qa;
  uStack_a6 = (undefined2)((ulong)in_XMM0_Qa >> 0x10);
  uStack_a4 = (undefined2)((ulong)in_XMM0_Qa >> 0x20);
  uStack_a2 = (undefined2)((ulong)in_XMM0_Qa >> 0x30);
  a_2[0]._0_2_ = (undefined2)in_XMM0_Qb;
  a_2[0]._2_2_ = (undefined2)((ulong)in_XMM0_Qb >> 0x10);
  a_2[0]._4_2_ = (undefined2)((ulong)in_XMM0_Qb >> 0x20);
  a_2[0]._6_2_ = (undefined2)((ulong)in_XMM0_Qb >> 0x30);
  a_lo[1]._4_4_ = (int)(CONCAT26(uStack_a6,CONCAT24(uStack_a6,CONCAT22(local_a8,local_a8))) >> 0x20)
  ;
  uStack_3c = (int)(CONCAT26(uStack_a2,CONCAT24(uStack_a2,CONCAT22(uStack_a4,uStack_a4))) >> 0x20);
  auVar1 = ZEXT416(0x10);
  a_1[1]._4_4_ = (int)(CONCAT26(a_2[0]._2_2_,
                                CONCAT24(a_2[0]._2_2_,
                                         CONCAT22((undefined2)a_2[0],(undefined2)a_2[0]))) >> 0x20);
  a_hi[0]._4_4_ =
       (int)(CONCAT26(a_2[0]._6_2_,CONCAT24(a_2[0]._6_2_,CONCAT22(a_2[0]._4_2_,a_2[0]._4_2_))) >>
            0x20);
  auVar2 = ZEXT416(0x10);
  *(ulong *)a[0] = CONCAT44(a_lo[1]._4_4_ >> auVar1,CONCAT22(local_a8,local_a8) >> auVar1);
  *(ulong *)(a[0] + 8) = CONCAT44(uStack_3c >> auVar1,CONCAT22(uStack_a4,uStack_a4) >> auVar1);
  *(ulong *)(a[0] + 0x10) =
       CONCAT44(a_1[1]._4_4_ >> auVar2,CONCAT22((undefined2)a_2[0],(undefined2)a_2[0]) >> auVar2);
  *(ulong *)(a[0] + 0x18) =
       CONCAT44(a_hi[0]._4_4_ >> auVar2,CONCAT22(a_2[0]._4_2_,a_2[0]._4_2_) >> auVar2);
  return;
}

Assistant:

static inline void store_16bit_to_32bit(__m128i a, int32_t *b) {
  const __m128i a_lo = _mm_unpacklo_epi16(a, a);
  const __m128i a_hi = _mm_unpackhi_epi16(a, a);
  const __m128i a_1 = _mm_srai_epi32(a_lo, 16);
  const __m128i a_2 = _mm_srai_epi32(a_hi, 16);
  _mm_store_si128((__m128i *)b, a_1);
  _mm_store_si128((__m128i *)(b + 4), a_2);
}